

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::PrintMarkCollectionStats(Recycler *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  sVar1 = (this->collectionStats).markData.markCount;
  lVar7 = ((this->collectionStats).tryMarkInteriorCount + (this->collectionStats).tryMarkCount) -
          ((this->collectionStats).remarkCount + sVar1);
  lVar6 = lVar7 - ((this->collectionStats).tryMarkNullCount +
                   (this->collectionStats).tryMarkUnalignedCount +
                   (this->collectionStats).tryMarkNonRecyclerMemoryCount +
                   (this->collectionStats).tryMarkInteriorNonRecyclerMemoryCount +
                  (this->collectionStats).tryMarkInteriorNullCount);
  lVar5 = sVar1 - (this->collectionStats).scanCount;
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"Try Mark    :%9s %5s %10s | Non-Mark  : %9s %5s | Mark    :%9s %5s \n",L"Count",
                L"%",L"Bytes",L"Count",L"%",L"Count",L"%");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  sVar2 = (this->collectionStats).tryMarkNullCount;
  auVar8._8_4_ = (int)(sVar2 >> 0x20);
  auVar8._0_8_ = sVar2;
  auVar8._12_4_ = 0x45300000;
  auVar15._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar15._0_8_ = lVar7;
  auVar15._12_4_ = 0x45300000;
  dVar13 = (double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0;
  dVar21 = auVar15._8_8_ - 1.9342813113834067e+25;
  dVar14 = dVar13 + dVar21;
  dVar13 = dVar13 + dVar21;
  sVar3 = (this->collectionStats).tryMarkCount;
  sVar4 = (this->collectionStats).scanCount;
  auVar16._8_4_ = (int)(sVar4 >> 0x20);
  auVar16._0_8_ = sVar4;
  auVar16._12_4_ = 0x45300000;
  sVar1 = (this->collectionStats).markData.markCount;
  auVar22._8_4_ = (int)(sVar1 >> 0x20);
  auVar22._0_8_ = sVar1;
  auVar22._12_4_ = 0x45300000;
  Output::Print(L" TryMark    :%9d       %10d | Null      : %9d %5.1f | Scan    :%9d %5.1f\n",
                ((((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                 (auVar8._8_8_ - 1.9342813113834067e+25)) / dVar14) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0) +
                 (auVar16._8_8_ - 1.9342813113834067e+25)) /
                (((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                (auVar22._8_8_ - 1.9342813113834067e+25))) * 100.0,sVar3,sVar3 * 8);
  sVar1 = (this->collectionStats).tryMarkCount;
  auVar25._8_4_ = (int)(sVar1 >> 0x20);
  auVar25._0_8_ = sVar1;
  auVar25._12_4_ = 0x45300000;
  sVar3 = (this->collectionStats).tryMarkUnalignedCount;
  auVar17._8_4_ = (int)(sVar3 >> 0x20);
  auVar17._0_8_ = sVar3;
  auVar17._12_4_ = 0x45300000;
  auVar23._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar23._0_8_ = lVar5;
  auVar23._12_4_ = 0x45300000;
  sVar2 = (this->collectionStats).markData.markCount;
  auVar26._8_4_ = (int)(sVar2 >> 0x20);
  auVar26._0_8_ = sVar2;
  auVar26._12_4_ = 0x45300000;
  Output::Print(L"   Non-Mark :%9d %5.1f            | Unaligned : %9d %5.1f | Leaf    :%9d %5.1f\n",
                (dVar14 / (((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                          (auVar25._8_8_ - 1.9342813113834067e+25))) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) +
                 (auVar17._8_8_ - 1.9342813113834067e+25)) / dVar14) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) +
                 (auVar23._8_8_ - 1.9342813113834067e+25)) /
                (((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                (auVar26._8_8_ - 1.9342813113834067e+25))) * 100.0,lVar7,sVar3,lVar5);
  sVar2 = (this->collectionStats).markData.markCount;
  auVar9._8_4_ = (int)(sVar2 >> 0x20);
  auVar9._0_8_ = sVar2;
  auVar9._12_4_ = 0x45300000;
  sVar1 = (this->collectionStats).tryMarkCount;
  auVar18._8_4_ = (int)(sVar1 >> 0x20);
  auVar18._0_8_ = sVar1;
  auVar18._12_4_ = 0x45300000;
  sVar3 = (this->collectionStats).tryMarkNonRecyclerMemoryCount;
  auVar19._8_4_ = (int)(sVar3 >> 0x20);
  auVar19._0_8_ = sVar3;
  auVar19._12_4_ = 0x45300000;
  Output::Print(L"   Mark     :%9d %5.1f %10d | Non GC    : %9d %5.1f | Track   :%9d\n",
                ((((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                 (auVar9._8_8_ - 1.9342813113834067e+25)) /
                (((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                (auVar18._8_8_ - 1.9342813113834067e+25))) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) +
                 (auVar19._8_8_ - 1.9342813113834067e+25)) / dVar14) * 100.0,sVar2,
                (this->collectionStats).markData.markBytes,sVar3,(this->collectionStats).trackCount)
  ;
  sVar2 = (this->collectionStats).remarkCount;
  auVar10._8_4_ = (int)(sVar2 >> 0x20);
  auVar10._0_8_ = sVar2;
  auVar10._12_4_ = 0x45300000;
  sVar1 = (this->collectionStats).tryMarkCount;
  auVar24._8_4_ = (int)(sVar1 >> 0x20);
  auVar24._0_8_ = sVar1;
  auVar24._12_4_ = 0x45300000;
  auVar20._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar20._0_8_ = lVar6;
  auVar20._12_4_ = 0x45300000;
  Output::Print(L"   Remark   :%9d %5.1f            | Invalid   : %9d %5.1f \n",
                ((((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                 (auVar10._8_8_ - 1.9342813113834067e+25)) /
                (((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                (auVar24._8_8_ - 1.9342813113834067e+25))) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
                 (auVar20._8_8_ - 1.9342813113834067e+25)) / dVar14) * 100.0,sVar2,lVar6);
  sVar1 = (this->collectionStats).tryMarkInteriorCount;
  sVar2 = (this->collectionStats).tryMarkInteriorNullCount;
  auVar11._8_4_ = (int)(sVar2 >> 0x20);
  auVar11._0_8_ = sVar2;
  auVar11._12_4_ = 0x45300000;
  Output::Print(L" TryMark Int:%9d       %10d | Null Int  : %9d %5.1f | Root    :%9d | New     :%9d\n"
                ,((((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                  (auVar11._8_8_ - 1.9342813113834067e+25)) / dVar14) * 100.0,sVar1,sVar1 * 8,sVar2,
                (this->collectionStats).rootCount,(this->collectionStats).markThruNewObjCount,dVar14
                ,dVar13);
  sVar1 = (this->collectionStats).tryMarkInteriorNonRecyclerMemoryCount;
  auVar12._8_4_ = (int)(sVar1 >> 0x20);
  auVar12._0_8_ = sVar1;
  auVar12._12_4_ = 0x45300000;
  Output::Print(L"                                        | Non GC Int: %9d %5.1f | Stack   :%9d | NewFalse:%9d\n"
                ,((((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                  (auVar12._8_8_ - 1.9342813113834067e+25)) / dVar14) * 100.0,sVar1,
                (this->collectionStats).stackCount,(this->collectionStats).markThruFalseNewObjCount)
  ;
  return;
}

Assistant:

void
Recycler::PrintMarkCollectionStats()
{
    size_t nonMark = collectionStats.tryMarkCount + collectionStats.tryMarkInteriorCount - collectionStats.remarkCount - collectionStats.markData.markCount;
    size_t invalidCount = nonMark - collectionStats.tryMarkNullCount - collectionStats.tryMarkUnalignedCount
        - collectionStats.tryMarkNonRecyclerMemoryCount
        - collectionStats.tryMarkInteriorNonRecyclerMemoryCount
        - collectionStats.tryMarkInteriorNullCount;
    size_t leafCount = collectionStats.markData.markCount - collectionStats.scanCount;
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("Try Mark    :%9s %5s %10s | Non-Mark  : %9s %5s | Mark    :%9s %5s \n"), _u("Count"), _u("%"), _u("Bytes"), _u("Count"), _u("%"), _u("Count"), _u("%"));
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u(" TryMark    :%9d       %10d | Null      : %9d %5.1f | Scan    :%9d %5.1f\n"),
        collectionStats.tryMarkCount, collectionStats.tryMarkCount * sizeof(void *),
        collectionStats.tryMarkNullCount, (double)collectionStats.tryMarkNullCount / (double)nonMark * 100,
        collectionStats.scanCount, (double)collectionStats.scanCount / (double)collectionStats.markData.markCount * 100);
    Output::Print(_u("   Non-Mark :%9d %5.1f            | Unaligned : %9d %5.1f | Leaf    :%9d %5.1f\n"),
        nonMark, (double)nonMark / (double)collectionStats.tryMarkCount * 100,
        collectionStats.tryMarkUnalignedCount, (double)collectionStats.tryMarkUnalignedCount / (double)nonMark * 100,
        leafCount, (double)leafCount / (double)collectionStats.markData.markCount * 100);
    Output::Print(_u("   Mark     :%9d %5.1f %10d | Non GC    : %9d %5.1f | Track   :%9d\n"),
        collectionStats.markData.markCount, (double)collectionStats.markData.markCount / (double)collectionStats.tryMarkCount * 100, collectionStats.markData.markBytes,
        collectionStats.tryMarkNonRecyclerMemoryCount, (double)collectionStats.tryMarkNonRecyclerMemoryCount / (double)nonMark * 100,
        collectionStats.trackCount);
    Output::Print(_u("   Remark   :%9d %5.1f            | Invalid   : %9d %5.1f \n"),
        collectionStats.remarkCount, (double)collectionStats.remarkCount / (double)collectionStats.tryMarkCount * 100,
        invalidCount, (double)invalidCount / (double)nonMark * 100);
    Output::Print(_u(" TryMark Int:%9d       %10d | Null Int  : %9d %5.1f | Root    :%9d | New     :%9d\n"),
        collectionStats.tryMarkInteriorCount, collectionStats.tryMarkInteriorCount * sizeof(void *),
        collectionStats.tryMarkInteriorNullCount, (double)collectionStats.tryMarkInteriorNullCount / (double)nonMark * 100,
        collectionStats.rootCount, collectionStats.markThruNewObjCount);
    Output::Print(_u("                                        | Non GC Int: %9d %5.1f | Stack   :%9d | NewFalse:%9d\n"),
        collectionStats.tryMarkInteriorNonRecyclerMemoryCount, (double)collectionStats.tryMarkInteriorNonRecyclerMemoryCount / (double)nonMark * 100,
        collectionStats.stackCount, collectionStats.markThruFalseNewObjCount);
}